

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::TextureCubeMipmapTestInstance::TextureCubeMipmapTestInstance
          (TextureCubeMipmapTestInstance *this,Context *context,
          TextureCubeMipmapTestCaseParameters *testParameters)

{
  deUint32 renderWidth;
  deBool dVar1;
  int iVar2;
  InternalError *this_00;
  TestTextureCube *pTVar3;
  RGBA local_a4;
  Vec4 local_a0;
  PixelBufferAccess local_90;
  uint local_68;
  uint local_64;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int faceNdx;
  int numLevels;
  SharedPtr<vkt::pipeline::TestTextureCube> local_40 [2];
  TextureCubeMipmapTestCaseParameters *local_20;
  TextureCubeMipmapTestCaseParameters *testParameters_local;
  Context *context_local;
  TextureCubeMipmapTestInstance *this_local;
  
  local_20 = testParameters;
  testParameters_local = (TextureCubeMipmapTestCaseParameters *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TextureCubeMipmapTestInstance_01671490;
  TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
            (&this->m_testParameters,local_20);
  de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr(&this->m_texture);
  renderWidth = (this->m_testParameters).super_TextureCubeTestCaseParameters.size * 2;
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,(Context *)testParameters_local,
             (this->m_testParameters).super_TextureCubeTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,renderWidth,renderWidth);
  while ((dVar1 = ::deGetFalse(), dVar1 == 0 &&
         (((this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType !=
           COORDTYPE_PROJECTED ||
          ((this->m_testParameters).super_TextureCubeTestCaseParameters.
           super_TextureCommonTestCaseParameters.sampleCount == VK_SAMPLE_COUNT_1_BIT))))) {
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      pTVar3 = (TestTextureCube *)operator_new(0x188);
      _faceNdx = ::vk::mapVkFormat((this->m_testParameters).super_TextureCubeTestCaseParameters.
                                   super_TextureCommonTestCaseParameters.format);
      vkt::pipeline::TestTextureCube::TestTextureCube
                (pTVar3,(TextureFormat *)&faceNdx,
                 (this->m_testParameters).super_TextureCubeTestCaseParameters.size);
      de::SharedPtr<vkt::pipeline::TestTextureCube>::SharedPtr(local_40,pTVar3);
      de::SharedPtr<vkt::pipeline::TestTextureCube>::operator=(&this->m_texture,local_40);
      de::SharedPtr<vkt::pipeline::TestTextureCube>::~SharedPtr(local_40);
      iVar2 = deLog2Floor32((this->m_testParameters).super_TextureCubeTestCaseParameters.size);
      levelNdx = iVar2 + 1;
      for (step = 0; (int)step < 6; step = step + 1) {
        for (inc = 0; (int)inc < levelNdx; inc = inc + 1) {
          dec = (deUint32)(0xff / (long)(levelNdx + -1));
          rgb = deClamp32(dec * inc,0,0xff);
          color = 0xff - rgb;
          local_64 = 0;
          switch(step) {
          case 0:
            local_64 = rgb << 0x10 | color * 0x100 | 0xff;
            break;
          case 1:
            local_64 = rgb << 8 | 0xff0000 | color;
            break;
          case 2:
            local_64 = color * 0x10000 | 0xff00 | rgb;
            break;
          case 3:
            local_64 = color * 0x10000 | rgb << 8 | 0xff;
            break;
          case 4:
            local_64 = color * 0x100 | 0xff0000 | rgb;
            break;
          case 5:
            local_64 = rgb << 0x10 | 0xff00 | color;
          }
          local_68 = local_64 | 0xff000000;
          pTVar3 = de::SharedPtr<vkt::pipeline::TestTextureCube>::operator->(&this->m_texture);
          (*(pTVar3->super_TestTexture)._vptr_TestTexture[7])
                    (&local_90,pTVar3,(ulong)inc,(ulong)step);
          tcu::RGBA::RGBA(&local_a4,local_68);
          tcu::RGBA::toVec((RGBA *)&local_a0);
          tcu::clear(&local_90,&local_a0);
        }
      }
      util::TextureRenderer::addCubeTexture(&this->m_renderer,&this->m_texture);
      return;
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,
             "!(m_testParameters.coordType == COORDTYPE_PROJECTED && m_testParameters.sampleCount != VK_SAMPLE_COUNT_1_BIT)"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureMipmapTests.cpp"
             ,0x1b1);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

TextureCubeMipmapTestInstance::TextureCubeMipmapTestInstance (Context& context, const TextureCubeMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_testParameters	(testParameters)
	, m_renderer		(context, m_testParameters.sampleCount, m_testParameters.size*2, m_testParameters.size*2)
{
	TCU_CHECK_INTERNAL(!(m_testParameters.coordType == COORDTYPE_PROJECTED && m_testParameters.sampleCount != VK_SAMPLE_COUNT_1_BIT));

	m_texture = TestTextureCubeSp(new pipeline::TestTextureCube(vk::mapVkFormat(m_testParameters.format), m_testParameters.size));

	const int numLevels = deLog2Floor32(m_testParameters.size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const deUint32	step	= 0xff / (numLevels-1);
			const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
			const deUint32	dec		= 0xff - inc;
			deUint32		rgb		= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			const deUint32	color	= 0xff000000 | rgb;
			tcu::clear(m_texture->getLevel(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}

	m_renderer.addCubeTexture(m_texture);
}